

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

float __thiscall
pbrt::PiecewiseLinear2D<3UL>::Evaluate(PiecewiseLinear2D<3UL> *this,Vector2f pos,Float *param)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint32_t i0;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint32_t size;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 in_register_00001208 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  float param_weight [6];
  float local_38 [6];
  
  auVar24._8_56_ = in_register_00001208;
  auVar24._0_8_ = pos.super_Tuple2<pbrt::Vector2,_float>;
  pvVar6 = (this->m_param_values).ptr;
  iVar15 = 0;
  lVar14 = 0;
  do {
    uVar3 = this->m_param_size[lVar14];
    if ((ulong)uVar3 == 1) {
      uVar2 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_38 + lVar14 * 2) = uVar2;
    }
    else {
      pfVar7 = pvVar6[lVar14].ptr;
      if (uVar3 < 3) {
        uVar16 = 0;
      }
      else {
        uVar16 = (ulong)uVar3 - 2;
        lVar17 = 1;
        uVar19 = uVar16;
        do {
          uVar18 = uVar19 >> 1;
          uVar19 = ~uVar18 + uVar19;
          lVar11 = uVar18 + 1 + lVar17;
          if (param[lVar14] < pfVar7[uVar18 + lVar17 & 0xffffffff]) {
            uVar19 = uVar18;
            lVar11 = lVar17;
          }
          lVar17 = lVar11;
        } while (0 < (long)uVar19);
        if (lVar17 - 1U < uVar16) {
          uVar16 = lVar17 - 1U;
        }
        if (lVar17 < 1) {
          uVar16 = 0;
        }
      }
      auVar25._0_4_ =
           (param[lVar14] - pfVar7[uVar16 & 0xffffffff]) /
           (pfVar7[(int)uVar16 + 1] - pfVar7[uVar16 & 0xffffffff]);
      auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar25);
      uVar2 = vcmpss_avx512f(auVar25,ZEXT816(0) << 0x40,1);
      fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar8._0_4_);
      local_38[lVar14 * 2 + 1] = fVar9;
      local_38[lVar14 * 2] = 1.0 - fVar9;
      iVar15 = (int)uVar16 * this->m_param_strides[lVar14] + iVar15;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  fVar9 = pos.super_Tuple2<pbrt::Vector2,_float>.x *
          (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  auVar8 = vmovshdup_avx(auVar24._0_16_);
  fVar10 = auVar8._0_4_ * (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar5 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  iVar1 = iVar5 + -2;
  iVar12 = (int)fVar9;
  iVar13 = (int)fVar10;
  if (iVar4 + -2 < iVar12) {
    iVar12 = iVar4 + -2;
  }
  if (iVar1 < iVar13) {
    iVar13 = iVar1;
  }
  size = iVar5 * iVar4;
  fVar9 = fVar9 - (float)iVar12;
  fVar10 = fVar10 - (float)iVar13;
  i0 = iVar15 * size + iVar12 + iVar13 * iVar4;
  fVar20 = lookup<3UL,_0>(this,(this->m_data).ptr,i0,size,local_38);
  fVar21 = lookup<3UL,_0>(this,(this->m_data).ptr + 1,i0,size,local_38);
  fVar22 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,i0,size,local_38);
  fVar23 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + 1,i0,size,
                          local_38);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar21)),ZEXT416((uint)(1.0 - fVar9)),
                           ZEXT416((uint)fVar20));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar23)),ZEXT416((uint)(1.0 - fVar9)),
                            ZEXT416((uint)fVar22));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * fVar10)),auVar8,
                           ZEXT416((uint)(1.0 - fVar10)));
  return (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
         (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y * auVar8._0_4_;
}

Assistant:

PBRT_CPU_GPU
    float Evaluate(Vector2f pos, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;

        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Compute linear interpolation weights */
        pos.x *= m_inv_patch_size.x;
        pos.y *= m_inv_patch_size.y;
        Vector2i offset = Min(Vector2i(pos), m_size - Vector2i(2, 2));

        Vector2f w1 = pos - Vector2f(Vector2i(offset)), w0 = Vector2f(1, 1) - w1;

        uint32_t index = offset.x + offset.y * m_size.x;

        uint32_t size = HProd(m_size);
        if (Dimension != 0)
            index += slice_offset * size;

        float v00 = lookup<Dimension>(m_data.data(), index, size, param_weight),
              v10 = lookup<Dimension>(m_data.data() + 1, index, size, param_weight),
              v01 =
                  lookup<Dimension>(m_data.data() + m_size.x, index, size, param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, index, size,
                                      param_weight);

        return FMA(w0.y, FMA(w0.x, v00, w1.x * v10), w1.y * FMA(w0.x, v01, w1.x * v11)) *
               HProd(m_inv_patch_size);
    }